

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

void __thiscall
gui::DialogBox::handleMousePress(DialogBox *this,Button button,Vector2f *mouseParent)

{
  Widget *this_00;
  float fVar1;
  element_type *peVar2;
  Vector2f VVar3;
  Vector2f *pVVar4;
  float fVar5;
  
  Group::handleMousePress(&this->super_Group,button,mouseParent);
  this_00 = &(this->super_Group).super_Container.super_Widget;
  VVar3 = Widget::toLocalOriginSpace(this_00,mouseParent);
  if ((button == Left) && (this->draggable_ == true)) {
    peVar2 = (this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    fVar1 = peVar2->titleBarHeight_;
    fVar5 = sf::Shape::getOutlineThickness(&(peVar2->rect_).super_Shape);
    if (VVar3.y <= fVar1 - fVar5) {
      fVar1 = mouseParent->y;
      (this->dragPoint_).first.x = mouseParent->x;
      (this->dragPoint_).first.y = fVar1;
      (this->dragPoint_).second = true;
      pVVar4 = Widget::getPosition(this_00);
      this->initialPosition_ = *pVVar4;
    }
  }
  return;
}

Assistant:

void DialogBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left && draggable_ && mouseLocal.y <= style_->titleBarHeight_ - style_->rect_.getOutlineThickness()) {
        dragPoint_ = {mouseParent, true};
        initialPosition_ = getPosition();
    }
}